

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O1

int Kit_SopDivisor(Kit_Sop_t *cResult,Kit_Sop_t *cSop,int nLits,Vec_Int_t *vMemory)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (1 < cSop->nCubes) {
    iVar1 = Kit_SopAnyLiteral(cSop,nLits);
    iVar2 = 0;
    if (iVar1 != -1) {
      Kit_SopDup(cResult,cSop,vMemory);
      Kit_SopDivisorZeroKernel_rec(cResult,nLits);
      iVar2 = 1;
      if (cResult->nCubes < 1) {
        __assert_fail("Kit_SopCubeNum(cResult) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitSop.c"
                      ,0x220,"int Kit_SopDivisor(Kit_Sop_t *, Kit_Sop_t *, int, Vec_Int_t *)");
      }
    }
  }
  return iVar2;
}

Assistant:

int Kit_SopDivisor( Kit_Sop_t * cResult, Kit_Sop_t * cSop, int nLits, Vec_Int_t * vMemory )
{
    if ( Kit_SopCubeNum(cSop) <= 1 )
        return 0;
    if ( Kit_SopAnyLiteral( cSop, nLits ) == -1 )
        return 0;
    // duplicate the cover
    Kit_SopDup( cResult, cSop, vMemory );
    // perform the kerneling
    Kit_SopDivisorZeroKernel_rec( cResult, nLits );
    assert( Kit_SopCubeNum(cResult) > 0 );
    return 1;
}